

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O0

void stretch_sprite(ALLEGRO_BITMAP *bmp,ALLEGRO_BITMAP *sprite,int x,int y,int w,int h)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  ALLEGRO_STATE state;
  undefined1 local_420 [1024];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  al_store_state(local_420,8);
  al_set_target_bitmap(local_8);
  uVar1 = local_10;
  iVar2 = al_get_bitmap_width(local_10);
  iVar3 = al_get_bitmap_height(local_10);
  al_draw_scaled_bitmap
            (0,0,(float)iVar2,(float)iVar3,(float)local_14,(float)local_18,(float)local_1c,
             (float)local_20,uVar1,0);
  al_restore_state(local_420);
  return;
}

Assistant:

void stretch_sprite(ALLEGRO_BITMAP *bmp, ALLEGRO_BITMAP *sprite,
		    int x, int y, int w, int h)
{
   ALLEGRO_STATE state;

   al_store_state(&state, ALLEGRO_STATE_TARGET_BITMAP);

   al_set_target_bitmap(bmp);
   al_draw_scaled_bitmap(sprite,
      0, 0, al_get_bitmap_width(sprite), al_get_bitmap_height(sprite),
      x, y, w, h, 0);

   al_restore_state(&state);
}